

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O0

int Gem_GroupVarsInsert1(int Groups,int i,int fGroup)

{
  uint local_1c;
  int Mask;
  int fGroup_local;
  int i_local;
  int Groups_local;
  
  if (i == -1) {
    local_1c = 0;
  }
  else {
    local_1c = Abc_InfoMask(i + 1);
  }
  if (-1 < i + 1) {
    if (((fGroup != 0) && (i != -1)) && ((Groups >> ((byte)i & 0x1f) & 1U) == 0)) {
      __assert_fail("!fGroup || i == -1 || ((Groups >> i) & 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/extra/extraUtilMaj.c"
                    ,0xa9,"int Gem_GroupVarsInsert1(int, int, int)");
    }
    if ((fGroup != 0) && (fGroup != 1)) {
      __assert_fail("fGroup == 0 || fGroup == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/extra/extraUtilMaj.c"
                    ,0xaa,"int Gem_GroupVarsInsert1(int, int, int)");
    }
    return Groups & local_1c | (Groups & (local_1c ^ 0xffffffff)) << 1 |
           fGroup << ((byte)i + 1 & 0x1f);
  }
  __assert_fail("i+1 >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/extra/extraUtilMaj.c"
                ,0xa8,"int Gem_GroupVarsInsert1(int, int, int)");
}

Assistant:

int Gem_GroupVarsInsert1( int Groups, int i, int fGroup ) // insert one bit after i
{
    int Mask = i+1 ? Abc_InfoMask( i+1 ) : 0;
    assert( i+1 >= 0 );
    assert( !fGroup || i == -1 || ((Groups >> i) & 1) );
    assert( fGroup == 0 || fGroup == 1 );
    return (Groups & Mask) | ((Groups & ~Mask) << 1) | (fGroup << (i+1));
}